

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::advance
          (SimpleParser<avro::parsing::JsonHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Symbol *this_01;
  Kind KVar1;
  tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar2;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar3;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *pwVar4;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar5;
  element_type *peVar6;
  size_t n;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  _Elt_pointer pSVar10;
  value_type *pvVar11;
  pointer __x;
  ProductionPtr pp;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1c8 [2];
  undefined1 local_1a8 [8];
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
LAB_0019a80f:
  do {
    while( true ) {
      pSVar10 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar10 ==
          (this->parsingStack).c.
          super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pSVar10 = (this->parsingStack).c.
                  super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      KVar1 = pSVar10[-1].kind_;
      if (KVar1 == k) goto LAB_0019aa00;
      if (0xe < KVar1 - sNull) break;
      throwMismatch(k,KVar1);
    }
    this_01 = pSVar10 + -1;
    switch(KVar1) {
    case sRoot:
      ptVar2 = boost::
               any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar10[-1].extra_);
      peVar6 = (ptVar2->super_type).head.px;
      for (pvVar11 = (peVar6->
                     super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pvVar11 !=
          (peVar6->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish; pvVar11 = pvVar11 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar11);
        peVar6 = (ptVar2->super_type).head.px;
      }
      goto LAB_0019a80f;
    case sRepeater:
      ptVar5 = boost::
               any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar10[-1].extra_);
      (ptVar5->super_type).head = (ptVar5->super_type).head - 1;
      peVar6 = (ptVar5->super_type).tail.tail.head.px;
      for (__x = (peVar6->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_start;
          __x != (peVar6->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,__x);
        peVar6 = (ptVar5->super_type).tail.tail.head.px;
      }
      goto LAB_0019a80f;
    case sIndirect:
      psVar3 = boost::
               any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar10[-1].extra_);
      local_1a8 = (undefined1  [8])psVar3->px;
      local_1a0[0].pi_ = (psVar3->pn).pi_;
      if (local_1a0[0].pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1a0[0].pi_)->use_count_ = (local_1a0[0].pi_)->use_count_ + 1;
        UNLOCK();
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar11 = *(value_type **)local_1a8; pvVar11 != *(pointer *)((long)local_1a8 + 8);
          pvVar11 = pvVar11 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar11);
      }
      break;
    case sSymbolic:
      pwVar4 = boost::
               any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar10[-1].extra_);
      local_1c8[0].px = pwVar4->px;
      local_1c8[0].pn.pi_ = (pwVar4->pn).pi_;
      if (local_1c8[0].pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1c8[0].pn.pi_)->weak_count_ = (local_1c8[0].pn.pi_)->weak_count_ + 1;
        UNLOCK();
      }
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  *)local_1a8,local_1c8);
      boost::detail::weak_count::~weak_count(&local_1c8[0].pn);
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar11 = *(value_type **)local_1a8; pvVar11 != *(pointer *)((long)local_1a8 + 8);
          pvVar11 = pvVar11 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar11);
      }
      break;
    case sSkipStart:
      goto switchD_0019a85c_caseD_1b;
    case sResolve:
      ppVar7 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         (&pSVar10[-1].extra_);
      if (ppVar7->second != k) {
        throwMismatch(ppVar7->second,k);
      }
      k = ppVar7->first;
LAB_0019aa00:
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      return k;
    default:
      if (KVar1 == sError) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
        Symbol::extra<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   this_01);
        std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)local_1a8);
        *puVar9 = 0x1cc910;
        puVar9[1] = 0x1cc940;
        __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
      }
    case sAlternative:
    case sPlaceholder:
    case sEnumAdjust:
    case sUnionAdjust:
      if (7 < KVar1 - sRecordStart) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Encountered ",0xc);
        poVar8 = std::operator<<((ostream *)local_1a8,
                                 *(char **)(Symbol::stringValues + (ulong)this_01->kind_ * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," while looking for ",0x13);
        std::operator<<(poVar8,*(char **)(Symbol::stringValues + (ulong)k * 8));
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)local_1c8);
        *puVar9 = 0x1cc910;
        puVar9[1] = 0x1cc940;
        __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
      }
      n = JsonHandler::handle(this->handler_,this_01);
      KVar1 = this_01->kind_;
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      if (KVar1 == sWriterUnion) {
        selectBranch(this,n);
      }
      goto LAB_0019a80f;
    }
    boost::detail::shared_count::~shared_count(local_1a0);
  } while( true );
switchD_0019a85c_caseD_1b:
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c);
  skip(this,this->decoder_);
  goto LAB_0019a80f;
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }